

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O2

bool __thiscall tcmalloc::Logger::AddNum(Logger *this,uint64_t num,int base)

{
  char *pcVar1;
  char *__src;
  ulong uVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  char local_48 [8];
  char space [22];
  
  uVar2 = (ulong)base;
  lVar4 = 0;
  pcVar1 = space + 0xd;
  do {
    __src = pcVar1;
    *__src = "0123456789abcdef"[num % uVar2];
    lVar4 = lVar4 + -1;
    if (num < uVar2) break;
    num = num / uVar2;
    pcVar1 = __src + -1;
  } while (local_48 < __src);
  lVar3 = (long)this->end_ - (long)this->p_;
  __n = -lVar4;
  if (SBORROW8(lVar3,__n) == lVar3 + lVar4 < 0) {
    memcpy(this->p_,__src,__n);
    this->p_ = this->p_ + -lVar4;
  }
  return SBORROW8(lVar3,__n) == lVar3 + lVar4 < 0;
}

Assistant:

bool Logger::AddNum(uint64_t num, int base) {
  static const char kDigits[] = "0123456789abcdef";
  char space[22];  // more than enough for 2^64 in smallest supported base (10)
  char* end = space + sizeof(space);
  char* pos = end;
  do {
    pos--;
    *pos = kDigits[num % base];
    num /= base;
  } while (num > 0 && pos > space);
  return AddStr(pos, end - pos);
}